

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::IstreamInputStream::CopyingIstreamInputStream::Read
          (CopyingIstreamInputStream *this,void *buffer,int size)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  int result;
  int local_4;
  
  std::istream::read(*(char **)(in_RDI + 8),in_RSI);
  local_4 = std::istream::gcount();
  if (((local_4 == 0) && (uVar1 = std::ios::fail(), (uVar1 & 1) != 0)) &&
     (uVar1 = std::ios::eof(), (uVar1 & 1) == 0)) {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int IstreamInputStream::CopyingIstreamInputStream::Read(void* buffer,
                                                        int size) {
  input_->read(reinterpret_cast<char*>(buffer), size);
  int result = input_->gcount();
  if (result == 0 && input_->fail() && !input_->eof()) {
    return -1;
  }
  return result;
}